

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.cpp
# Opt level: O1

string * hmac_hash::sha512(string *__return_storage_ptr__,string *input)

{
  size_type sVar1;
  pointer __dest;
  size_t i;
  long lVar2;
  byte *__s;
  size_type __dnew;
  uint8_t digest [64];
  char buf [129];
  SHA512 ctx;
  size_type local_250;
  byte local_248 [208];
  SHA512 local_178;
  
  local_248[0x30] = 0;
  local_248[0x31] = 0;
  local_248[0x32] = 0;
  local_248[0x33] = 0;
  local_248[0x34] = 0;
  local_248[0x35] = 0;
  local_248[0x36] = 0;
  local_248[0x37] = 0;
  local_248[0x38] = 0;
  local_248[0x39] = 0;
  local_248[0x3a] = 0;
  local_248[0x3b] = 0;
  local_248[0x3c] = 0;
  local_248[0x3d] = 0;
  local_248[0x3e] = 0;
  local_248[0x3f] = 0;
  local_248[0x20] = 0;
  local_248[0x21] = 0;
  local_248[0x22] = 0;
  local_248[0x23] = 0;
  local_248[0x24] = 0;
  local_248[0x25] = 0;
  local_248[0x26] = 0;
  local_248[0x27] = 0;
  local_248[0x28] = 0;
  local_248[0x29] = 0;
  local_248[0x2a] = 0;
  local_248[0x2b] = 0;
  local_248[0x2c] = 0;
  local_248[0x2d] = 0;
  local_248[0x2e] = 0;
  local_248[0x2f] = 0;
  local_248[0x10] = 0;
  local_248[0x11] = 0;
  local_248[0x12] = 0;
  local_248[0x13] = 0;
  local_248[0x14] = 0;
  local_248[0x15] = 0;
  local_248[0x16] = 0;
  local_248[0x17] = 0;
  local_248[0x18] = 0;
  local_248[0x19] = 0;
  local_248[0x1a] = 0;
  local_248[0x1b] = 0;
  local_248[0x1c] = 0;
  local_248[0x1d] = 0;
  local_248[0x1e] = 0;
  local_248[0x1f] = 0;
  local_248[0] = 0;
  local_248[1] = 0;
  local_248[2] = 0;
  local_248[3] = 0;
  local_248[4] = 0;
  local_248[5] = 0;
  local_248[6] = 0;
  local_248[7] = 0;
  local_248[8] = 0;
  local_248[9] = 0;
  local_248[10] = 0;
  local_248[0xb] = 0;
  local_248[0xc] = 0;
  local_248[0xd] = 0;
  local_248[0xe] = 0;
  local_248[0xf] = 0;
  local_178.m_h[0] = 0x6a09e667f3bcc908;
  local_178.m_h[1] = 0xbb67ae8584caa73b;
  local_178.m_h[2] = 0x3c6ef372fe94f82b;
  local_178.m_h[3] = 0xa54ff53a5f1d36f1;
  local_178.m_h[4] = 0x510e527fade682d1;
  local_178.m_h[5] = 0x9b05688c2b3e6c1f;
  local_178.m_h[6] = 0x1f83d9abfb41bd6b;
  local_178.m_h[7] = 0x5be0cd19137e2179;
  local_178.m_tot_len = 0;
  local_178.m_len = 0;
  SHA512::update(&local_178,(uint8_t *)(input->_M_dataplus)._M_p,input->_M_string_length);
  SHA512::finish(&local_178,local_248);
  __s = local_248 + 0x40;
  memset(__s,0,0x81);
  lVar2 = 0;
  do {
    sprintf((char *)__s,"%02x",(ulong)local_248[lVar2]);
    lVar2 = lVar2 + 1;
    __s = __s + 2;
  } while (lVar2 != 0x40);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  local_250 = 0x80;
  __dest = (pointer)std::__cxx11::string::_M_create
                              ((ulong *)__return_storage_ptr__,(ulong)&local_250);
  sVar1 = local_250;
  (__return_storage_ptr__->_M_dataplus)._M_p = __dest;
  (__return_storage_ptr__->field_2)._M_allocated_capacity = local_250;
  memcpy(__dest,local_248 + 0x40,0x80);
  __return_storage_ptr__->_M_string_length = sVar1;
  __dest[sVar1] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string sha512(const std::string &input) {
        uint8_t digest[hmac_hash::SHA512::DIGEST_SIZE];
        std::fill(digest, digest + hmac_hash::SHA512::DIGEST_SIZE, '\0');
        hmac_hash::SHA512 ctx;
        ctx.init();
        ctx.update((uint8_t*)input.c_str(), input.length());
        ctx.finish(digest);

        char buf[2 * hmac_hash::SHA512::DIGEST_SIZE + 1];
        std::fill(buf, buf + (2 * hmac_hash::SHA512::DIGEST_SIZE + 1), '\0');
        for(size_t i = 0; i < hmac_hash::SHA512::DIGEST_SIZE; ++i){
            sprintf(buf + i * 2, "%02x", digest[i]);
        }
        return std::string(buf, (2 * hmac_hash::SHA512::DIGEST_SIZE));
    }